

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_arrayreverse(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQInteger SVar2;
  long lVar3;
  SQObjectPtr *this;
  HSQUIRRELVM in_RDI;
  SQInteger i;
  SQInteger n;
  SQInteger size;
  SQObjectPtr t;
  SQArray *arr;
  SQObjectPtr *o;
  SQObjectPtr *in_stack_ffffffffffffff80;
  SQObjectPtr *in_stack_ffffffffffffff88;
  SQObjectPtr **in_stack_ffffffffffffffa0;
  SQUnsignedInteger pos;
  undefined8 in_stack_ffffffffffffffa8;
  SQObjectType type;
  SQInteger in_stack_ffffffffffffffb0;
  HSQUIRRELVM in_stack_ffffffffffffffb8;
  SQObjectPtr local_38;
  long local_28;
  long local_20;
  SQVM *local_10;
  SQRESULT local_8;
  
  type = (SQObjectType)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_10 = in_RDI;
  SVar2 = sq_gettop(in_RDI);
  if (SVar2 < 1) {
    SQVM::Raise_Error(local_10,"not enough params in the stack");
    local_8 = -1;
  }
  else {
    bVar1 = sq_aux_gettypedarg(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,type,
                               in_stack_ffffffffffffffa0);
    if (bVar1) {
      local_28 = *(long *)(local_20 + 8);
      SVar2 = SQArray::Size((SQArray *)0x11689b);
      if (SVar2 < 1) {
        local_8 = 0;
      }
      else {
        SQObjectPtr::SQObjectPtr(&local_38);
        SVar2 = SQArray::Size((SQArray *)0x1168b9);
        lVar3 = SVar2 >> 1;
        for (pos = 0; (long)pos < lVar3; pos = pos + 1) {
          this = sqvector<SQObjectPtr>::operator[]((sqvector<SQObjectPtr> *)(local_28 + 0x30),pos);
          SQObjectPtr::operator=(this,in_stack_ffffffffffffff88);
          in_stack_ffffffffffffff88 =
               sqvector<SQObjectPtr>::operator[]
                         ((sqvector<SQObjectPtr> *)(local_28 + 0x30),(SVar2 + -1) - pos);
          in_stack_ffffffffffffff80 =
               sqvector<SQObjectPtr>::operator[]((sqvector<SQObjectPtr> *)(local_28 + 0x30),pos);
          SQObjectPtr::operator=(this,in_stack_ffffffffffffff88);
          sqvector<SQObjectPtr>::operator[]
                    ((sqvector<SQObjectPtr> *)(local_28 + 0x30),(SVar2 + -1) - pos);
          SQObjectPtr::operator=(this,in_stack_ffffffffffffff88);
        }
        local_8 = 0;
        SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff80);
      }
    }
    else {
      local_8 = -1;
    }
  }
  return local_8;
}

Assistant:

SQRESULT sq_arrayreverse(HSQUIRRELVM v,SQInteger idx)
{
    sq_aux_paramscheck(v, 1);
    SQObjectPtr *o;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,o);
    SQArray *arr = _array(*o);
    if(arr->Size() > 0) {
        SQObjectPtr t;
        SQInteger size = arr->Size();
        SQInteger n = size >> 1; size -= 1;
        for(SQInteger i = 0; i < n; i++) {
            t = arr->_values[i];
            arr->_values[i] = arr->_values[size-i];
            arr->_values[size-i] = t;
        }
        return SQ_OK;
    }
    return SQ_OK;
}